

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O0

void GPS2EnvCoordSystem(double lat_env,double long_env,double alt_env,double angle_env,
                       double latitude,double longitude,double altitude,double *pX,double *pY,
                       double *pZ)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_70;
  double z_enu;
  double y_enu;
  double x_enu;
  double *pZ_local;
  double *pY_local;
  double *pX_local;
  double altitude_local;
  double longitude_local;
  double latitude_local;
  double angle_env_local;
  double alt_env_local;
  double long_env_local;
  double lat_env_local;
  
  y_enu = 0.0;
  z_enu = 0.0;
  local_70 = 0.0;
  x_enu = (double)pZ;
  pZ_local = pY;
  pY_local = pX;
  pX_local = (double *)altitude;
  altitude_local = longitude;
  longitude_local = latitude;
  latitude_local = angle_env;
  angle_env_local = alt_env;
  alt_env_local = long_env;
  long_env_local = lat_env;
  GPS2RefCoordSystem(lat_env,long_env,alt_env,latitude,longitude,altitude,&y_enu,&z_enu,&local_70,0)
  ;
  dVar5 = y_enu;
  dVar3 = cos(-latitude_local);
  dVar1 = z_enu;
  dVar4 = sin(-latitude_local);
  dVar2 = y_enu;
  *pY_local = dVar5 * dVar3 + -(dVar1 * dVar4);
  dVar5 = sin(-latitude_local);
  dVar1 = z_enu;
  dVar3 = cos(-latitude_local);
  *pZ_local = dVar2 * dVar5 + dVar1 * dVar3;
  *(double *)x_enu = local_70;
  return;
}

Assistant:

inline void GPS2EnvCoordSystem(double lat_env, double long_env, double alt_env, double angle_env,
							   double latitude, double longitude, double altitude,
							   double* pX, double* pY, double* pZ)
{
	double x_enu = 0, y_enu = 0, z_enu = 0;

	GPS2RefCoordSystem(lat_env, long_env, alt_env, latitude, longitude, altitude, &x_enu, &y_enu, &z_enu, EAST_NORTH_UP_COORDINATE_SYSTEM);

	// Conversion from East - North - Up to environment coordinate system.
	*pX = x_enu*cos(-angle_env)-y_enu*sin(-angle_env);
	*pY = x_enu*sin(-angle_env)+y_enu*cos(-angle_env);
	*pZ = z_enu;
}